

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

CTSize lj_ctype_vlsize(CTState *cts,CType *ct,CTSize nelem)

{
  ushort uVar1;
  CType *pCVar2;
  CTSize local_104;
  CType *ctf;
  CTypeID fid;
  CTypeID arrid;
  uint64_t xsz;
  CType *pCStack_e0;
  CTSize nelem_local;
  CType *ct_local;
  CTState *cts_local;
  CType *local_c0;
  CType *ct_1;
  CType *local_78;
  
  _fid = 0;
  pCStack_e0 = ct;
  if (ct->info >> 0x1c == 1) {
    ctf._4_4_ = 0;
    _fid = (ulong)ct->size;
    uVar1 = ct->sib;
    while (ctf._0_4_ = (uint)uVar1, (uint)ctf != 0) {
      pCVar2 = cts->tab + (uint)ctf;
      if (pCVar2->info >> 0x1c == 9) {
        ctf._4_4_ = pCVar2->info & 0xffff;
      }
      uVar1 = pCVar2->sib;
    }
    for (local_c0 = cts->tab + ctf._4_4_; local_c0->info >> 0x1c == 8;
        local_c0 = cts->tab + (local_c0->info & 0xffff)) {
    }
    pCStack_e0 = local_c0;
  }
  local_78 = pCStack_e0;
  do {
    local_78 = cts->tab + (local_78->info & 0xffff);
  } while (local_78->info >> 0x1c == 8);
  _fid = (ulong)local_78->size * (ulong)nelem + _fid;
  if (_fid < 0x80000000) {
    local_104 = (CTSize)_fid;
  }
  else {
    local_104 = 0xffffffff;
  }
  return local_104;
}

Assistant:

CTSize lj_ctype_vlsize(CTState *cts, CType *ct, CTSize nelem)
{
  uint64_t xsz = 0;
  if (ctype_isstruct(ct->info)) {
    CTypeID arrid = 0, fid = ct->sib;
    xsz = ct->size;  /* Add the struct size. */
    while (fid) {
      CType *ctf = ctype_get(cts, fid);
      if (ctype_type(ctf->info) == CT_FIELD)
	arrid = ctype_cid(ctf->info);  /* Remember last field of VLS. */
      fid = ctf->sib;
    }
    ct = ctype_raw(cts, arrid);
  }
  lj_assertCTS(ctype_isvlarray(ct->info), "VLA expected");
  ct = ctype_rawchild(cts, ct);  /* Get array element. */
  lj_assertCTS(ctype_hassize(ct->info), "bad VLA without size");
  /* Calculate actual size of VLA and check for overflow. */
  xsz += (uint64_t)ct->size * nelem;
  return xsz < 0x80000000u ? (CTSize)xsz : CTSIZE_INVALID;
}